

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_var_def(SyntaxAnalyze *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  undefined4 uVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  element_type *peVar5;
  size_type sVar6;
  element_type *peVar7;
  element_type *peVar8;
  SyntaxAnalyze *in_RDI;
  localArrayInitType in_stack_00000164;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000168;
  int in_stack_00000170;
  SymbolKind in_stack_00000174;
  string *in_stack_00000178;
  irGenerator *in_stack_00000180;
  int in_stack_00000190;
  shared_ptr<front::optimization::bmir_variable_table::VarSingle> varSingle;
  shared_ptr<front::express::ExpressNode> *value_2;
  iterator __end5;
  iterator __begin5;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range5;
  int32_t constValue;
  bool isConst_1;
  shared_ptr<front::optimization::bmir_variable_table::VarArray> varArray;
  shared_ptr<front::express::ExpressNode> *value_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range4_1;
  vector<int,_std::allocator<int>_> constValues;
  bool isConst;
  string addrTmp;
  SharedExNdPtr var_2;
  string addr;
  shared_ptr<front::express::ExpressNode> var_1;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range3;
  RightVal rightvalue2;
  RightVal rightvalue1;
  int offset;
  bool needAssgin;
  string initPtr;
  RightVal rightVal;
  string valueName;
  shared_ptr<front::express::ExpressNode> value;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range4;
  int i;
  shared_ptr<front::express::ExpressNode> var;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inits;
  localArrayInitType initType;
  SharedSyPtr symbol;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  init_values;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  dimensions;
  SharedExNdPtr dimension;
  SymbolKind kind;
  string name;
  undefined4 in_stack_fffffffffffff658;
  int iVar9;
  undefined4 in_stack_fffffffffffff65c;
  ArraySymbol *in_stack_fffffffffffff660;
  Token in_stack_fffffffffffff668;
  int in_stack_fffffffffffff66c;
  SyntaxAnalyze *in_stack_fffffffffffff670;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff684;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff688;
  ArraySymbol *in_stack_fffffffffffff690;
  undefined8 in_stack_fffffffffffff698;
  undefined8 in_stack_fffffffffffff6a0;
  undefined2 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6aa;
  undefined4 in_stack_fffffffffffff6ab;
  undefined1 in_stack_fffffffffffff6af;
  IntSymbol *in_stack_fffffffffffff6b0;
  string *in_stack_fffffffffffff6b8;
  uint32_t uVar11;
  undefined1 *puVar10;
  ArraySymbol *in_stack_fffffffffffff6c0;
  irGenerator *in_stack_fffffffffffff6c8;
  uint32_t in_stack_fffffffffffff6ec;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *in_stack_fffffffffffff6f0;
  irGenerator *in_stack_fffffffffffff6f8;
  SyntaxAnalyze *in_stack_fffffffffffff700;
  RightVal *in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7ac;
  irGenerator *in_stack_fffffffffffff7b0;
  undefined8 in_stack_fffffffffffff7c8;
  Token tk;
  SyntaxAnalyze *in_stack_fffffffffffff7d0;
  TyKind in_stack_fffffffffffff7e4;
  irGenerator *in_stack_fffffffffffff7e8;
  undefined1 begin;
  LeftVal *in_stack_fffffffffffff7f0;
  undefined6 in_stack_fffffffffffff7f8;
  undefined1 in_stack_fffffffffffff7fe;
  irGenerator *in_stack_fffffffffffff800;
  LeftVal *in_stack_fffffffffffff808;
  undefined7 in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff817;
  string local_7c8 [32];
  string local_7a8 [48];
  reference local_778;
  shared_ptr<front::express::ExpressNode> *local_770;
  __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
  local_768;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *local_760;
  int local_758;
  byte local_751;
  string local_750 [32];
  string local_730 [32];
  int *local_710;
  int *local_708;
  reference local_6f0;
  shared_ptr<front::express::ExpressNode> *local_6e8;
  __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
  local_6e0;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *local_6d8;
  byte local_6b1;
  undefined1 local_6b0 [256];
  string local_5b0 [32];
  string local_590 [332];
  int local_444;
  string local_440 [32];
  string local_420 [80];
  shared_ptr<front::express::ExpressNode> *local_3d0;
  __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
  local_3c8;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *local_3c0;
  string local_368 [112];
  int local_2f8;
  byte local_2f1;
  string local_2f0 [72];
  string local_2a8 [32];
  string local_288 [72];
  string local_240 [48];
  undefined4 local_210;
  int local_20c;
  shared_ptr<front::express::ExpressNode> *local_1f8;
  __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
  local_1f0;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *local_1e8;
  undefined4 local_1dc;
  RightVal local_1d8;
  undefined1 local_1b0 [136];
  _Base_ptr local_128;
  size_t sStack_120;
  undefined8 local_118;
  string local_110 [39];
  undefined1 local_e9;
  string local_e8 [32];
  undefined1 local_c8 [88];
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  local_70;
  undefined1 local_58 [24];
  undefined1 local_40 [64];
  
  std::__cxx11::string::string((string *)(local_40 + 0x18));
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2a3549);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)0x2a3556);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)0x2a3563);
  std::shared_ptr<front::symbol::Symbol>::shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2a3570);
  match_one_word(in_stack_fffffffffffff7d0,(Token)((ulong)in_stack_fffffffffffff7c8 >> 0x20));
  get_least_matched_word((SyntaxAnalyze *)0x2a358e);
  word::Word::get_self_abi_cxx11_
            ((Word *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
  std::__cxx11::string::operator=((string *)(local_40 + 0x18),(string *)(local_c8 + 0x10));
  std::__cxx11::string::~string((string *)(local_c8 + 0x10));
  bVar2 = try_word(in_stack_fffffffffffff670,in_stack_fffffffffffff66c,in_stack_fffffffffffff668);
  iVar9 = (int)((ulong)in_stack_fffffffffffff698 >> 0x20);
  tk = (Token)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
  if (bVar2) {
    local_40._20_4_ = 2;
    while( true ) {
      in_stack_fffffffffffff817 =
           try_word(in_stack_fffffffffffff670,in_stack_fffffffffffff66c,in_stack_fffffffffffff668);
      iVar9 = (int)((ulong)in_stack_fffffffffffff698 >> 0x20);
      tk = (Token)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
      if (!(bool)in_stack_fffffffffffff817) break;
      match_one_word(in_stack_fffffffffffff7d0,tk);
      gm_const_exp((SyntaxAnalyze *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      in_stack_fffffffffffff808 = (LeftVal *)local_40;
      in_stack_fffffffffffff800 = (irGenerator *)local_c8;
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff660,
                 (shared_ptr<front::express::ExpressNode> *)
                 CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a36a1);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)in_stack_fffffffffffff670,
                  (value_type *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      match_one_word(in_stack_fffffffffffff7d0,(Token)((ulong)in_stack_fffffffffffff7c8 >> 0x20));
    }
  }
  else {
    local_40._20_4_ = 0;
  }
  uVar3 = try_word(in_stack_fffffffffffff670,in_stack_fffffffffffff66c,in_stack_fffffffffffff668);
  if ((bool)uVar3) {
    match_one_word(in_stack_fffffffffffff7d0,tk);
    in_stack_fffffffffffff7fe =
         try_word(in_stack_fffffffffffff670,in_stack_fffffffffffff66c,in_stack_fffffffffffff668);
    if ((bool)in_stack_fffffffffffff7fe) {
      match_one_word(in_stack_fffffffffffff7d0,tk);
      gm_init_val(in_stack_fffffffffffff700,
                  (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec);
      match_one_word(in_stack_fffffffffffff7d0,tk);
    }
    else {
      gm_init_val(in_stack_fffffffffffff700,
                  (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec);
    }
  }
  if (local_40._20_4_ == 0) {
    in_stack_fffffffffffff7f0 = (LeftVal *)operator_new(0x40);
    uVar11 = (uint32_t)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
    local_e9 = 1;
    std::__cxx11::string::string(local_e8,(string *)(local_40 + 0x18));
    front::symbol::IntSymbol::IntSymbol
              (in_stack_fffffffffffff6b0,
               (string *)
               CONCAT17(in_stack_fffffffffffff6af,
                        CONCAT43(in_stack_fffffffffffff6ab,
                                 CONCAT12(in_stack_fffffffffffff6aa,in_stack_fffffffffffff6a8))),
               (int)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff6a0 >> 0x18,0),iVar9);
    local_e9 = 0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffff670,
               (IntSymbol *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    std::__cxx11::string::~string(local_e8);
    in_stack_fffffffffffff7e8 = &in_RDI->irGenerator;
    std::__cxx11::string::string(local_110,(string *)(local_40 + 0x18));
    peVar5 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a38b3);
    in_stack_fffffffffffff7e4 = front::symbol::Symbol::getId(peVar5);
    local_128 = (_Base_ptr)0x0;
    sStack_120 = 0;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2a38f0);
    iVar9 = 0;
    irGenerator::irGenerator::ir_declare_value
              (in_stack_00000180,in_stack_00000178,in_stack_00000174,in_stack_00000170,
               in_stack_00000168,in_stack_00000164,in_stack_00000190);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff670);
    std::__cxx11::string::~string(local_110);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2a39f8);
    operator_new(0x78);
    local_1b0[0x3f] = 1;
    std::__cxx11::string::string((string *)(local_1b0 + 0x50),(string *)(local_40 + 0x18));
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol
              (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
               (SharedSyPtr *)in_stack_fffffffffffff6b0,
               CONCAT13(in_stack_fffffffffffff6af,(int3)((uint)in_stack_fffffffffffff6ab >> 8)),
               SUB41(in_stack_fffffffffffff6ab,0),(bool)in_stack_fffffffffffff6aa);
    local_1b0[0x3f] = 0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffff670,
               (ArraySymbol *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    std::shared_ptr<front::symbol::Symbol>::~shared_ptr
              ((shared_ptr<front::symbol::Symbol> *)0x2a3a96);
    std::__cxx11::string::~string((string *)(local_1b0 + 0x50));
    local_1b0._48_8_ = local_58;
    local_1b0._40_8_ =
         std::
         vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
         ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    local_1b0._32_8_ =
         std::
         vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
         ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                               *)in_stack_fffffffffffff660,
                              (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658)),
          bVar2) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                   *)(local_1b0 + 0x28));
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff660,
                 (shared_ptr<front::express::ExpressNode> *)
                 CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      in_stack_fffffffffffff7b0 = (irGenerator *)local_1b0;
      std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                ((shared_ptr<front::symbol::Symbol> *)
                 CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      std::__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a3b4a);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff660,
                 (shared_ptr<front::express::ExpressNode> *)
                 CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      front::symbol::ArraySymbol::addDimension
                (in_stack_fffffffffffff660,
                 (SharedExNdPtr *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a3b93);
      std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                ((shared_ptr<front::symbol::ArraySymbol> *)0x2a3ba0);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a3bad);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                    *)(local_1b0 + 0x28));
    }
    bVar2 = inGlobalLayer(in_RDI);
    uVar11 = (uint32_t)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
    in_stack_fffffffffffff7ac = CONCAT13(bVar2,(int3)in_stack_fffffffffffff7ac);
    if (bVar2) {
      bVar2 = std::
              vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ::empty((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                       *)in_stack_fffffffffffff670);
      if (bVar2) {
        local_1d8.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._20_4_ = 0;
        while( true ) {
          uVar1 = local_1d8.
                  super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                  super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                  super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                  super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                  super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u.
                  _20_4_;
          in_stack_fffffffffffff7a0 = &local_1d8;
          std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                    ((shared_ptr<front::symbol::Symbol> *)
                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
          std::
          __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a3d14);
          in_stack_fffffffffffff7a8 = front::symbol::ArraySymbol::getLen(in_stack_fffffffffffff690);
          std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                    ((shared_ptr<front::symbol::ArraySymbol> *)0x2a3d32);
          uVar11 = (uint32_t)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
          if (in_stack_fffffffffffff7a8 <= (int)uVar1) break;
          local_1dc = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff660,
                     (value_type *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
          local_1d8.
          super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
          super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
          super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
          super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
          super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._20_4_ =
               local_1d8.
               super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
               super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
               super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._20_4_
               + 1;
        }
      }
      else {
        local_1e8 = &local_70;
        local_1f0._M_current =
             (shared_ptr<front::express::ExpressNode> *)
             std::
             vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                      *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
        local_1f8 = (shared_ptr<front::express::ExpressNode> *)
                    std::
                    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                           *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                              *)in_stack_fffffffffffff660,
                             (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
          uVar11 = (uint32_t)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
          if (!bVar2) break;
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
          ::operator*(&local_1f0);
          std::shared_ptr<front::express::ExpressNode>::shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff660,
                     (shared_ptr<front::express::ExpressNode> *)
                     CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
          peVar7 = std::
                   __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a3e2b);
          if (peVar7->_type == CNS) {
            peVar7 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a3e3d);
            local_20c = peVar7->_value;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff660,
                       (value_type *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
          }
          else {
            local_210 = 0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff660,
                       (value_type *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
          }
          std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)0x2a3eb7);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
          ::operator++(&local_1f0);
        }
      }
    }
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              ((shared_ptr<front::symbol::Symbol> *)
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    std::__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2a3ef7);
    iVar4 = front::symbol::ArraySymbol::getLen(in_stack_fffffffffffff690);
    iVar9 = irGenerator::TopLocalSmallArrayLength;
    std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
              ((shared_ptr<front::symbol::ArraySymbol> *)0x2a3f25);
    if (iVar9 < iVar4) {
      bVar2 = std::
              vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ::empty((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                       *)in_stack_fffffffffffff670);
      if (bVar2) {
        local_c8._68_4_ = 3;
      }
      else {
        local_c8._68_4_ = 4;
      }
    }
    else {
      bVar2 = std::
              vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ::empty((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                       *)in_stack_fffffffffffff670);
      if (bVar2) {
        local_c8._68_4_ = 1;
      }
      else {
        local_c8._68_4_ = 2;
      }
    }
    std::__cxx11::string::string(local_240,(string *)(local_40 + 0x18));
    peVar5 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a3ff9);
    front::symbol::Symbol::getId(peVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff6b0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffff6af,
                        CONCAT43(in_stack_fffffffffffff6ab,
                                 CONCAT12(in_stack_fffffffffffff6aa,in_stack_fffffffffffff6a8))));
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              ((shared_ptr<front::symbol::Symbol> *)
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    std::__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2a4059);
    iVar9 = front::symbol::ArraySymbol::getLen(in_stack_fffffffffffff690);
    irGenerator::irGenerator::ir_declare_value
              (in_stack_00000180,in_stack_00000178,in_stack_00000174,in_stack_00000170,
               in_stack_00000168,in_stack_00000164,in_stack_00000190);
    std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
              ((shared_ptr<front::symbol::ArraySymbol> *)0x2a40b8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff670);
    std::__cxx11::string::~string(local_240);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff670);
  }
  sVar6 = std::
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ::size(&local_70);
  if (sVar6 != 0) {
    std::__cxx11::string::string(local_2a8,(string *)(local_40 + 0x18));
    peVar5 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a4193);
    front::symbol::Symbol::getId(peVar5);
    irGenerator::irGenerator::getVarName
              (in_stack_fffffffffffff6c8,(string *)in_stack_fffffffffffff6c0,uVar11);
    std::__cxx11::string::~string(local_2a8);
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x2a41e4);
    peVar5 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a41f1);
    iVar4 = (**peVar5->_vptr_Symbol)();
    if (iVar4 == 2) {
      std::__cxx11::string::string(local_2f0);
      local_2f8 = 0;
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2a423a);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2a4247);
      bVar2 = inGlobalLayer(in_RDI);
      if (bVar2) {
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e4);
        std::__cxx11::string::operator=(local_2f0,local_368);
        std::__cxx11::string::~string(local_368);
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff660,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff65c,iVar9));
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff660,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff65c,iVar9));
        irGenerator::irGenerator::ir_ref
                  (in_stack_fffffffffffff800,
                   (LeftVal *)
                   CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7f8)),
                   in_stack_fffffffffffff7f0,SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a432f);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a433c);
      }
      else {
        std::__cxx11::string::operator=(local_2f0,local_288);
      }
      local_3c0 = &local_70;
      local_3c8._M_current =
           (shared_ptr<front::express::ExpressNode> *)
           std::
           vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
      local_3d0 = (shared_ptr<front::express::ExpressNode> *)
                  std::
                  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                         *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                                 *)in_stack_fffffffffffff660,
                                (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff65c,iVar9)), bVar2) {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
        ::operator*(&local_3c8);
        std::shared_ptr<front::express::ExpressNode>::shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff660,
                   (shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffff65c,iVar9));
        local_2f1 = 0;
        peVar5 = std::
                 __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a4485);
        iVar4 = (**peVar5->_vptr_Symbol)();
        if (iVar4 == 2) {
          std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                    ((shared_ptr<front::symbol::Symbol> *)
                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
          std::
          __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a44d3);
          std::shared_ptr<front::express::ExpressNode>::shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff660,
                     (shared_ptr<front::express::ExpressNode> *)
                     CONCAT44(in_stack_fffffffffffff65c,iVar9));
          front::symbol::ArraySymbol::addValue
                    (in_stack_fffffffffffff660,
                     (SharedExNdPtr *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
          std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)0x2a451c);
          std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                    ((shared_ptr<front::symbol::ArraySymbol> *)0x2a4529);
        }
        peVar7 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a4584);
        if ((peVar7->_type == CNS) &&
           (peVar7 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a4596), peVar7->_value != 0)) {
          std::
          __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a45a9);
          std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                    ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff660,(int *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
          local_2f1 = 1;
        }
        else {
          peVar7 = std::
                   __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a45d6);
          if (peVar7->_type == VAR) {
            std::
            __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a45e8);
            std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                      ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
            local_2f1 = 1;
          }
        }
        if ((local_2f1 & 1) != 0) {
          if (local_2f8 < 1) {
            std::variant<int,std::__cxx11::string>::
            variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                      ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff660,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff65c,iVar9));
            std::
            variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff660,
                      (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
            irGenerator::irGenerator::ir_store
                      (in_stack_fffffffffffff7b0,
                       (LeftVal *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                       in_stack_fffffffffffff7a0);
            std::
            variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2a4920);
            std::
            variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2a492d);
          }
          else {
            std::__cxx11::string::string(local_420);
            irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                      (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e4);
            std::__cxx11::string::operator=(local_420,local_440);
            std::__cxx11::string::~string(local_440);
            local_444 = local_2f8 << 2;
            std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
                      ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff660,(int *)CONCAT44(in_stack_fffffffffffff65c,iVar9)
                      );
            in_stack_fffffffffffff700 = (SyntaxAnalyze *)&in_RDI->irGenerator;
            std::variant<int,std::__cxx11::string>::
            variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                      ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff660,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff65c,iVar9));
            std::variant<int,int,std::__cxx11::string>::
            variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                      ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff660,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff65c,iVar9));
            std::
            variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff660,
                      (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
            irGenerator::irGenerator::ir_op
                      ((irGenerator *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                       in_stack_fffffffffffff808,(RightVal *)in_stack_fffffffffffff800,
                       (RightVal *)
                       CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7f8))
                       ,(Op)((ulong)in_stack_fffffffffffff7f0 >> 0x20));
            std::
            variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2a4733);
            std::
            variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2a4740);
            std::
            variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2a474d);
            in_stack_fffffffffffff6f8 = &in_RDI->irGenerator;
            std::variant<int,std::__cxx11::string>::
            variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                      ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff660,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff65c,iVar9));
            std::
            variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff660,
                      (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
            irGenerator::irGenerator::ir_store
                      (in_stack_fffffffffffff7b0,
                       (LeftVal *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                       in_stack_fffffffffffff7a0);
            std::
            variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2a47bb);
            std::
            variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2a47c8);
            std::__cxx11::string::~string(local_420);
          }
        }
        local_2f8 = local_2f8 + 1;
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a4995);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
        ::operator++(&local_3c8);
      }
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2a49c3);
      std::
      variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2a49d0);
      std::__cxx11::string::~string(local_2f0);
    }
    else {
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::front((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
               *)in_stack_fffffffffffff660);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff660,
                 (shared_ptr<front::express::ExpressNode> *)
                 CONCAT44(in_stack_fffffffffffff65c,iVar9));
      peVar7 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a4a38);
      if (peVar7->_type == CNS) {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a4a4a);
        std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff660,(int *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
      }
      else {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a4a88);
        std::variant<int,int,std::__cxx11::string>::emplace<2ul,std::__cxx11::string&>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
      }
      bVar2 = inGlobalLayer(in_RDI);
      if (bVar2) {
        std::__cxx11::string::string(local_590);
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e4);
        begin = (undefined1)((ulong)in_stack_fffffffffffff7e8 >> 0x38);
        std::__cxx11::string::operator=(local_590,local_5b0);
        std::__cxx11::string::~string(local_5b0);
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff660,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff65c,iVar9));
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff660,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff65c,iVar9));
        irGenerator::irGenerator::ir_ref
                  (in_stack_fffffffffffff800,
                   (LeftVal *)
                   CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffff7fe,in_stack_fffffffffffff7f8)),
                   in_stack_fffffffffffff7f0,(bool)begin);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a4b8f);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a4b9c);
        in_stack_fffffffffffff6c8 = &in_RDI->irGenerator;
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff660,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff65c,iVar9));
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff660,
                  (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
        irGenerator::irGenerator::ir_store
                  (in_stack_fffffffffffff7b0,
                   (LeftVal *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                   in_stack_fffffffffffff7a0);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a4c04);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a4c11);
        std::__cxx11::string::~string(local_590);
      }
      else {
        in_stack_fffffffffffff6c0 = (ArraySymbol *)&in_RDI->irGenerator;
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff660,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff65c,iVar9));
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff660,
                  (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
        irGenerator::irGenerator::ir_assign
                  (in_stack_fffffffffffff7b0,
                   (LeftVal *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                   in_stack_fffffffffffff7a0);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a4d40);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a4d4d);
      }
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a4da2);
    }
    std::
    variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2a4dc0);
    std::__cxx11::string::~string(local_288);
  }
  puVar10 = local_6b0;
  std::shared_ptr<front::symbol::Symbol>::shared_ptr
            ((shared_ptr<front::symbol::Symbol> *)in_stack_fffffffffffff660,
             (shared_ptr<front::symbol::Symbol> *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
  symbolTable::SymbolTable::push_symbol
            ((SymbolTable *)in_stack_fffffffffffff700,(SharedSyPtr *)in_stack_fffffffffffff6f8);
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2a4e37)
  ;
  bVar2 = std::
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ::empty((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)in_stack_fffffffffffff670);
  if ((!bVar2) && (bVar2 = inGlobalLayer(in_RDI), bVar2)) {
    peVar5 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a4e79);
    iVar4 = (**peVar5->_vptr_Symbol)();
    if (iVar4 == 2) {
      local_6b1 = 1;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2a4eac);
      local_6d8 = &local_70;
      local_6e0._M_current =
           (shared_ptr<front::express::ExpressNode> *)
           std::
           vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
      local_6e8 = (shared_ptr<front::express::ExpressNode> *)
                  std::
                  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                         *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                            *)in_stack_fffffffffffff660,
                           (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
        uVar11 = (uint32_t)((ulong)puVar10 >> 0x20);
        if (!bVar2) break;
        local_6f0 = __gnu_cxx::
                    __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                    ::operator*(&local_6e0);
        peVar7 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a4f26);
        uVar11 = (uint32_t)((ulong)puVar10 >> 0x20);
        if (peVar7->_type != CNS) {
          local_6b1 = 0;
          break;
        }
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a4f38);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff670,
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
        ::operator++(&local_6e0);
      }
      if ((local_6b1 & 1) != 0) {
        std::make_shared<front::optimization::bmir_variable_table::VarArray,bool&>
                  ((bool *)in_stack_fffffffffffff688);
        std::
        __shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2a4fdf);
        local_708 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff65c,iVar9));
        local_710 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)
                                      CONCAT44(in_stack_fffffffffffff65c,iVar9));
        __first._M_current._4_4_ = in_stack_fffffffffffff684;
        __first._M_current._0_4_ = in_stack_fffffffffffff680;
        std::vector<int,std::allocator<int>>::
        assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff670,__first,
                   in_stack_fffffffffffff678);
        std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a505d);
        front::symbol::Symbol::getName_abi_cxx11_
                  ((Symbol *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
        peVar5 = std::
                 __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a507c);
        front::symbol::Symbol::getId(peVar5);
        irGenerator::irGenerator::getVarName
                  (in_stack_fffffffffffff6c8,(string *)in_stack_fffffffffffff6c0,uVar11);
        optimization::bmir_variable_table::BmirVariableTable::insertVarArray
                  ((BmirVariableTable *)in_stack_fffffffffffff670,
                   (string *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                   (shared_ptr<front::optimization::bmir_variable_table::VarArray> *)
                   in_stack_fffffffffffff660);
        std::__cxx11::string::~string(local_730);
        std::__cxx11::string::~string(local_750);
        std::shared_ptr<front::optimization::bmir_variable_table::VarArray>::~shared_ptr
                  ((shared_ptr<front::optimization::bmir_variable_table::VarArray> *)0x2a50ed);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff670);
    }
    else {
      peVar5 = std::
               __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a5189);
      iVar4 = (**peVar5->_vptr_Symbol)();
      if (iVar4 == 0) {
        local_751 = 1;
        local_760 = &local_70;
        local_768._M_current =
             (shared_ptr<front::express::ExpressNode> *)
             std::
             vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                      *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
        local_770 = (shared_ptr<front::express::ExpressNode> *)
                    std::
                    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                           *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                              *)in_stack_fffffffffffff660,
                             (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
          uVar11 = (uint32_t)((ulong)puVar10 >> 0x20);
          if (!bVar2) break;
          local_778 = __gnu_cxx::
                      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                      ::operator*(&local_768);
          peVar7 = std::
                   __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a5226);
          uVar11 = (uint32_t)((ulong)puVar10 >> 0x20);
          if (peVar7->_type != CNS) {
            local_751 = 0;
            break;
          }
          peVar7 = std::
                   __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a5238);
          local_758 = peVar7->_value;
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
          ::operator++(&local_768);
        }
        if ((local_751 & 1) != 0) {
          std::make_shared<front::optimization::bmir_variable_table::VarSingle,bool&>
                    ((bool *)in_stack_fffffffffffff688);
          iVar4 = local_758;
          peVar8 = std::
                   __shared_ptr_access<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a529c);
          peVar8->initValue = iVar4;
          in_stack_fffffffffffff670 = (SyntaxAnalyze *)&in_RDI->bmirVariableTable;
          std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a52d3);
          front::symbol::Symbol::getName_abi_cxx11_
                    ((Symbol *)CONCAT44(in_stack_fffffffffffff65c,iVar9));
          peVar5 = std::
                   __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a52f2);
          iVar9 = front::symbol::Symbol::getId(peVar5);
          irGenerator::irGenerator::getVarName
                    (in_stack_fffffffffffff6c8,(string *)in_stack_fffffffffffff6c0,uVar11);
          optimization::bmir_variable_table::BmirVariableTable::insertVarSingle
                    ((BmirVariableTable *)in_stack_fffffffffffff670,(string *)CONCAT44(iVar4,iVar9),
                     (shared_ptr<front::optimization::bmir_variable_table::VarSingle> *)
                     in_stack_fffffffffffff660);
          std::__cxx11::string::~string(local_7a8);
          std::__cxx11::string::~string(local_7c8);
          std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>::~shared_ptr
                    ((shared_ptr<front::optimization::bmir_variable_table::VarSingle> *)0x2a5363);
        }
      }
    }
  }
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2a53e3)
  ;
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             *)in_stack_fffffffffffff670);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             *)in_stack_fffffffffffff670);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2a540a);
  std::__cxx11::string::~string((string *)(local_40 + 0x18));
  return;
}

Assistant:

void SyntaxAnalyze::gm_var_def() {
  string name;
  SymbolKind kind;
  SharedExNdPtr dimension;
  vector<SharedExNdPtr> dimensions;
  vector<SharedExNdPtr> init_values;
  SharedSyPtr symbol;
  irGenerator::localArrayInitType initType;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    kind = SymbolKind::Array;
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      dimension = gm_const_exp();
      dimensions.push_back(dimension);
      match_one_word(Token::RBRACK);
    }
  } else {
    kind = SymbolKind::INT;
  }

  if (try_word(1, Token::ASSIGN)) {
    match_one_word(Token::ASSIGN);
    if (try_word(1, Token::LBRACE)) {
      match_one_word(Token::LBRACE);
      gm_init_val(init_values, dimensions, 0);
      match_one_word(Token::RBRACE);
    } else {
      gm_init_val(init_values, dimensions, 0);
    }
  }

  if (kind == SymbolKind::INT) {
    symbol.reset(new IntSymbol(name, layer_num, false));
    irGenerator.ir_declare_value(name, kind, symbol->getId(), {});
  } else {
    vector<uint32_t> inits;

    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 layer_num, false, false));
    for (auto var : dimensions) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(var);
    }

    if (inGlobalLayer()) {
      if (init_values.empty()) {
        for (int i = 0;
             i < std::static_pointer_cast<ArraySymbol>(symbol)->getLen(); i++) {
          inits.push_back(0);
        }
      } else {
        for (auto value : init_values) {
          if (value->_type == NodeType::CNS) {
            inits.push_back(value->_value);
          } else {
            inits.push_back(0);
          }
        }
      }
    }

    if (std::static_pointer_cast<ArraySymbol>(symbol)->getLen() <=
        irGenerator::TopLocalSmallArrayLength) {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::SmallInit;
      } else {
        initType = irGenerator::localArrayInitType::Small;
      }
    } else {
      if (!init_values.empty()) {
        initType = irGenerator::localArrayInitType::BigInit;
      } else {
        initType = irGenerator::localArrayInitType::BigNoInit;
      }
    }

    irGenerator.ir_declare_value(
        name, kind, symbol->getId(), inits, initType,
        std::static_pointer_cast<ArraySymbol>(symbol)->getLen());
  }

  if (init_values.size() > 0) {
    string valueName = irGenerator.getVarName(name, symbol->getId());
    irGenerator::RightVal rightVal;

    if (symbol->kind() == SymbolKind::Array) {
      string initPtr;
      bool needAssgin;
      int offset = 0;
      RightVal rightvalue1;
      RightVal rightvalue2;

      if (inGlobalLayer()) {
        initPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(initPtr, valueName);
      } else {
        initPtr = valueName;
      }

      for (auto var : init_values) {
        needAssgin = false;
        if (symbol->kind() == SymbolKind::Array) {
          std::static_pointer_cast<ArraySymbol>(symbol)->addValue(var);
        }

        if (var->_type == NodeType::CNS && var->_value != 0) {
          rightVal.emplace<0>(var->_value);
          needAssgin = true;
        } else if (var->_type == NodeType::VAR) {
          rightVal.emplace<2>(var->_name);
          needAssgin = true;
        }

        if (needAssgin) {
          if (offset > 0) {
            string addr;

            addr = irGenerator.getNewTmpValueName(mir::types::TyKind::Ptr);
            rightvalue1.emplace<0>(offset * mir::types::INT_SIZE);
            irGenerator.ir_op(addr, initPtr, rightvalue1, Op::Add);
            irGenerator.ir_store(addr, rightVal);
          } else {
            irGenerator.ir_store(initPtr, rightVal);
          }
        }
        offset++;
      }
    } else {
      SharedExNdPtr var = init_values.front();

      if (var->_type == NodeType::CNS) {
        rightVal.emplace<0>(var->_value);
      } else {
        rightVal.emplace<2>(var->_name);
      }

      if (inGlobalLayer()) {
        string addrTmp;

        addrTmp = irGenerator.getNewTmpValueName(TyKind::Ptr);
        irGenerator.ir_ref(addrTmp, valueName);
        irGenerator.ir_store(addrTmp, rightVal);
      } else {
        irGenerator.ir_assign(valueName, rightVal);
      }
    }
  }
  symbolTable.push_symbol(symbol);

  if (!init_values.empty()) {
    if (inGlobalLayer()) {
      if (symbol->kind() == SymbolKind::Array) {
        bool isConst = true;
        std::vector<int32_t> constValues;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValues.push_back(value->_value);
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarArray>
              varArray =
                  std::make_shared<optimization::bmir_variable_table::VarArray>(
                      isConst);

          varArray->initValues.assign(constValues.begin(), constValues.end());
          bmirVariableTable.insertVarArray(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varArray);
        }
      } else if (symbol->kind() == SymbolKind::INT) {
        bool isConst = true;
        int32_t constValue;

        for (auto &value : init_values) {
          if (value->_type == NodeType::CNS) {
            constValue = value->_value;
          } else {
            isConst = false;
            break;
          }
        }

        if (isConst) {
          std::shared_ptr<optimization::bmir_variable_table::VarSingle>
              varSingle = std::make_shared<
                  optimization::bmir_variable_table::VarSingle>(isConst);

          varSingle->initValue = constValue;
          bmirVariableTable.insertVarSingle(
              irGenerator.getVarName(symbol->getName(), symbol->getId()),
              varSingle);
        }
      }
    }
  }
}